

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::copy
          (SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SourceLocation SVar4;
  byte *pbVar5;
  byte *pbVar6;
  pointer pEVar7;
  byte *pbVar8;
  pointer pEVar9;
  byte *pbVar10;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar8 = pbVar5 + sVar1 * 0x28;
  if (*(byte **)(dst + 8) < pbVar8) {
    pbVar6 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x28,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_00366574;
    pEVar7 = this->data_;
    pEVar9 = pEVar7 + sVar1;
    pbVar8 = pbVar6 + sVar1 * 0x28;
    pbVar5 = pbVar6;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar8;
    pEVar7 = this->data_;
    pEVar9 = pEVar7 + sVar1;
    pbVar6 = pbVar5;
  }
  do {
    pbVar10 = pbVar5 + 0x28;
    *(AssertionExpr **)(pbVar5 + 0x20) = (pEVar7->sequence).ptr;
    uVar2 = *(undefined8 *)&pEVar7->delay;
    uVar3 = *(undefined8 *)
             &(pEVar7->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged;
    SVar4 = (pEVar7->delayRange).endLoc;
    *(SourceLocation *)(pbVar5 + 0x10) = (pEVar7->delayRange).startLoc;
    *(SourceLocation *)(pbVar5 + 0x18) = SVar4;
    *(undefined8 *)pbVar5 = uVar2;
    *(undefined8 *)(pbVar5 + 8) = uVar3;
    if (pEVar7 + 1 == pEVar9) break;
    pEVar7 = pEVar7 + 1;
    pbVar5 = pbVar10;
  } while (pbVar10 != pbVar8);
LAB_00366574:
  return (int)pbVar6;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }